

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlAttr *attr;
  int iVar3;
  int iVar4;
  rnndelem *prVar5;
  rnndelem **pprVar6;
  rnndelem *prVar7;
  uint64_t uVar8;
  int iVar9;
  xmlNode *node_00;
  xmlNode *node_01;
  rnnetype rVar10;
  char *pcVar11;
  _xmlAttr *p_Var12;
  rnndb *prVar13;
  xmlNode *pxVar14;
  
  pxVar2 = node->name;
  iVar3 = strcmp((char *)pxVar2,"use-group");
  if (iVar3 == 0) {
    prVar7 = (rnndelem *)calloc(0x108,1);
    prVar7->file = file;
    prVar7->type = RNN_ETYPE_USE_GROUP;
    for (attr = node->properties; attr != (xmlAttr *)0x0; attr = attr->next) {
      pxVar2 = attr->name;
      iVar3 = strcmp((char *)pxVar2,"name");
      if (iVar3 == 0) {
        pcVar11 = getattrib(db,file,(uint)node->line,attr);
        pcVar11 = strdup(pcVar11);
        prVar7->name = pcVar11;
      }
      else {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,(ulong)node->line,pxVar2,
                node->name);
        db->estatus = 1;
      }
    }
    if (prVar7->name != (char *)0x0) {
      return prVar7;
    }
    pcVar11 = "%s:%d: nameless use-group\n";
    goto LAB_00106169;
  }
  iVar3 = strcmp((char *)pxVar2,"stripe");
  pxVar14 = node;
  if (iVar3 == 0) {
    rVar10 = RNN_ETYPE_STRIPE;
LAB_00105abe:
    prVar7 = (rnndelem *)calloc(0x108,1);
    prVar7->type = rVar10;
    prVar7->length = 1;
    prVar7->file = file;
    p_Var12 = node->properties;
    if (p_Var12 != (_xmlAttr *)0x0) {
      pxVar14 = (xmlNode *)&stderr;
      do {
        pxVar2 = p_Var12->name;
        iVar4 = strcmp((char *)pxVar2,"name");
        if (iVar4 == 0) {
          pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
          pcVar11 = strdup(pcVar11);
          prVar7->name = pcVar11;
        }
        else {
          iVar4 = strcmp((char *)pxVar2,"offset");
          if (iVar4 == 0) {
            uVar8 = getnumattrib(db,file,(uint)node->line,p_Var12);
            prVar7->offset = uVar8;
          }
          else {
            iVar4 = strcmp((char *)pxVar2,"length");
            if (iVar4 == 0) {
              uVar8 = getnumattrib(db,file,(uint)node->line,p_Var12);
              prVar7->length = uVar8;
            }
            else {
              iVar4 = strcmp((char *)pxVar2,"stride");
              if (iVar4 == 0) {
                uVar8 = getnumattrib(db,file,(uint)node->line,p_Var12);
                prVar7->stride = uVar8;
              }
              else {
                iVar4 = strcmp((char *)pxVar2,"prefix");
                if (iVar4 == 0) {
                  pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
                  pcVar11 = strdup(pcVar11);
                  (prVar7->varinfo).prefixstr = pcVar11;
                }
                else {
                  iVar4 = strcmp((char *)pxVar2,"varset");
                  if (iVar4 == 0) {
                    pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
                    pcVar11 = strdup(pcVar11);
                    (prVar7->varinfo).varsetstr = pcVar11;
                  }
                  else {
                    iVar4 = strcmp((char *)pxVar2,"variants");
                    if (iVar4 == 0) {
                      pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
                      pcVar11 = strdup(pcVar11);
                      (prVar7->varinfo).variantsstr = pcVar11;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",file,
                              (ulong)node->line,pxVar2,node->name);
                      db->estatus = 1;
                    }
                  }
                }
              }
            }
          }
        }
        p_Var12 = p_Var12->next;
      } while (p_Var12 != (_xmlAttr *)0x0);
    }
    for (prVar13 = (rnndb *)node->children; prVar13 != (rnndb *)0x0;
        prVar13 = (rnndb *)prVar13->bitsets) {
      if (*(int *)&(prVar13->copyright).license == 1) {
        prVar5 = trydelem(db,file,(xmlNode *)prVar13);
        if (prVar5 == (rnndelem *)0x0) {
          pcVar11 = file;
          iVar4 = trytop(db,file,(xmlNode *)prVar13);
          if ((iVar4 == 0) && (iVar4 = trydoc(prVar13,pcVar11,node_00), iVar4 == 0)) {
            fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&prVar13->files,
                    node->name,(prVar13->copyright).authors);
            db->estatus = 1;
          }
        }
        else {
          iVar4 = prVar7->subelemsnum;
          pxVar14 = (xmlNode *)(long)iVar4;
          iVar1 = prVar7->subelemsmax;
          if (iVar1 <= iVar4) {
            iVar9 = iVar1 * 2;
            if (iVar1 == 0) {
              iVar9 = 0x10;
            }
            prVar7->subelemsmax = iVar9;
            pprVar6 = (rnndelem **)realloc(prVar7->subelems,(long)iVar9 << 3);
            prVar7->subelems = pprVar6;
          }
          prVar7->subelemsnum = iVar4 + 1;
          prVar7->subelems[(long)pxVar14] = prVar5;
        }
      }
    }
    if (iVar3 == 0) {
      return prVar7;
    }
    if (prVar7->stride != 0) {
      return prVar7;
    }
    trydelem_cold_1();
LAB_00105dd0:
    iVar3 = 8;
  }
  else {
    iVar4 = strcmp((char *)pxVar2,"array");
    if (iVar4 == 0) {
      rVar10 = RNN_ETYPE_ARRAY;
      goto LAB_00105abe;
    }
    iVar3 = strcmp((char *)pxVar2,"reg8");
    if (iVar3 == 0) goto LAB_00105dd0;
    iVar3 = strcmp((char *)pxVar2,"reg16");
    if (iVar3 == 0) {
      iVar3 = 0x10;
    }
    else {
      iVar3 = strcmp((char *)pxVar2,"reg32");
      if (iVar3 == 0) {
        iVar3 = 0x20;
      }
      else {
        iVar3 = strcmp((char *)pxVar2,"reg64");
        if (iVar3 != 0) {
          return (rnndelem *)0x0;
        }
        iVar3 = 0x40;
      }
    }
  }
  prVar7 = (rnndelem *)calloc(0x108,1);
  prVar7->file = file;
  prVar7->type = RNN_ETYPE_REG;
  prVar7->width = iVar3;
  prVar7->length = 1;
  prVar7->access = RNN_ACCESS_RW;
  p_Var12 = pxVar14->properties;
  if (p_Var12 != (_xmlAttr *)0x0) {
    do {
      pxVar2 = p_Var12->name;
      iVar3 = strcmp((char *)pxVar2,"name");
      if (iVar3 == 0) {
        pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
        pcVar11 = strdup(pcVar11);
        prVar7->name = pcVar11;
      }
      else {
        iVar3 = strcmp((char *)pxVar2,"offset");
        if (iVar3 == 0) {
          uVar8 = getnumattrib(db,file,(uint)node->line,p_Var12);
          prVar7->offset = uVar8;
        }
        else {
          iVar3 = strcmp((char *)pxVar2,"length");
          if (iVar3 == 0) {
            uVar8 = getnumattrib(db,file,(uint)node->line,p_Var12);
            prVar7->length = uVar8;
          }
          else {
            iVar3 = strcmp((char *)pxVar2,"stride");
            if (iVar3 == 0) {
              uVar8 = getnumattrib(db,file,(uint)node->line,p_Var12);
              prVar7->stride = uVar8;
            }
            else {
              iVar3 = strcmp((char *)pxVar2,"varset");
              if (iVar3 == 0) {
                pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
                pcVar11 = strdup(pcVar11);
                (prVar7->varinfo).varsetstr = pcVar11;
              }
              else {
                iVar3 = strcmp((char *)pxVar2,"variants");
                if (iVar3 == 0) {
                  pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
                  pcVar11 = strdup(pcVar11);
                  (prVar7->varinfo).variantsstr = pcVar11;
                }
                else {
                  iVar3 = strcmp((char *)pxVar2,"access");
                  if (iVar3 == 0) {
                    pcVar11 = getattrib(db,file,(uint)node->line,p_Var12);
                    iVar3 = strcmp(pcVar11,"r");
                    if (iVar3 == 0) {
                      prVar7->access = RNN_ACCESS_R;
                    }
                    else {
                      iVar3 = strcmp(pcVar11,"w");
                      if (iVar3 == 0) {
                        prVar7->access = RNN_ACCESS_W;
                      }
                      else {
                        iVar3 = strcmp(pcVar11,"rw");
                        if (iVar3 == 0) {
                          prVar7->access = RNN_ACCESS_RW;
                        }
                        else {
                          fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",file,
                                  (ulong)node->line,pcVar11);
                        }
                      }
                    }
                  }
                  else {
                    iVar3 = trytypeattr(db,file,node,p_Var12,&prVar7->typeinfo);
                    if (iVar3 == 0) {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",file,
                              (ulong)node->line,p_Var12->name);
                      db->estatus = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      p_Var12 = p_Var12->next;
    } while (p_Var12 != (_xmlAttr *)0x0);
  }
  prVar13 = (rnndb *)node->children;
  if (prVar13 != (rnndb *)0x0) {
    do {
      if ((((*(int *)&(prVar13->copyright).license == 1) &&
           (iVar3 = trytypetag(db,file,(xmlNode *)prVar13,&prVar7->typeinfo), iVar3 == 0)) &&
          (pcVar11 = file, iVar3 = trytop(db,file,(xmlNode *)prVar13), iVar3 == 0)) &&
         (iVar3 = trydoc(prVar13,pcVar11,node_01), iVar3 == 0)) {
        fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)*(ushort *)&prVar13->files,
                node->name,(prVar13->copyright).authors);
        db->estatus = 1;
      }
      prVar13 = (rnndb *)prVar13->bitsets;
    } while (prVar13 != (rnndb *)0x0);
  }
  if (prVar7->name != (char *)0x0) {
    return prVar7;
  }
  pcVar11 = "%s:%d: nameless register\n";
LAB_00106169:
  fprintf(_stderr,pcVar11,file,(ulong)node->line);
  db->estatus = 1;
  return (rnndelem *)0x0;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}